

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

void __thiscall
embree::SceneGraph::QuadMeshNode::QuadMeshNode
          (QuadMeshNode *this,Ref<embree::SceneGraph::MaterialNode> *material,BBox1f time_range,
          size_t numTimeSteps)

{
  MaterialNode *pMVar1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> vStack_48;
  
  (this->super_Node).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (this->super_Node).fileName._M_dataplus._M_p = (pointer)&(this->super_Node).fileName.field_2;
  (this->super_Node).fileName._M_string_length = 0;
  (this->super_Node).fileName.field_2._M_local_buf[0] = '\0';
  (this->super_Node).name._M_dataplus._M_p = (pointer)&(this->super_Node).name.field_2;
  (this->super_Node).name._M_string_length = 0;
  (this->super_Node).name.field_2._M_local_buf[0] = '\0';
  (this->super_Node).indegree = 0;
  (this->super_Node).closed = true;
  (this->super_Node).hasLightOrCamera = false;
  (this->super_Node).id = 0xffffffff;
  (this->super_Node).geometry = (void *)0x0;
  (this->super_Node).super_RefCount._vptr_RefCount = (_func_int **)&PTR__QuadMeshNode_002e68e8;
  this->time_range = time_range;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->positions).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->normals).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->normals).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->normals).
  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->texcoords).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->texcoords).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->texcoords).super__Vector_base<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->quads).
  super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->quads).
  super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->quads).
  super__Vector_base<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar1 = material->ptr;
  (this->material).ptr = pMVar1;
  if (pMVar1 != (MaterialNode *)0x0) {
    (*(pMVar1->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  if (numTimeSteps != 0) {
    do {
      vStack_48.size_active = 0;
      vStack_48.size_alloced = 0;
      vStack_48.items = (Vec3fa *)0x0;
      std::
      vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
      ::
      emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                  *)&this->positions,&vStack_48);
      alignedFree(vStack_48.items);
      numTimeSteps = numTimeSteps - 1;
    } while (numTimeSteps != 0);
  }
  return;
}

Assistant:

QuadMeshNode (Ref<MaterialNode> material, const BBox1f time_range = BBox1f(0,1), size_t numTimeSteps = 0 ) 
        : Node(true), time_range(time_range), material(material) 
      {
        for (size_t i=0; i<numTimeSteps; i++)
          positions.push_back(avector<Vertex>());
      }